

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

BOOL SetEvent(HANDLE hEvent)

{
  PAL_ERROR dwLastError;
  CPalThread *pthr_00;
  CPalThread *pthr;
  PAL_ERROR palError;
  HANDLE hEvent_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalSetEvent(pthr_00,hEvent,1);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

BOOL
PALAPI
SetEvent(
     IN HANDLE hEvent)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr = NULL;

    PERF_ENTRY(SetEvent);
    ENTRY("SetEvent(hEvent=%p)\n", hEvent);

    pthr = InternalGetCurrentThread();
    
    palError = InternalSetEvent(pthr, hEvent, TRUE);

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }
    
    LOGEXIT("SetEvent returns BOOL %d\n", (NO_ERROR == palError));
    PERF_EXIT(SetEvent);
    return (NO_ERROR == palError);
}